

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O2

bool __thiscall Js::SCACore::Serializer::WriteValue(Serializer *this,Var rootObject)

{
  ScriptContext *scriptContext;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_88 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  
  scriptContext = (this->m_streamWriter).super_ScriptContextHolder.m_scriptContext;
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_88,unaff_retaddr,&stack0x00000000,true,false,false);
  ScriptContext::OnScriptStart(scriptContext,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&__entryExitRecord.handledExceptionType)
  ;
  SCASerializationEngine::Serialize
            (rootObject,&this->m_streamWriter,this->m_transferableVars,this->m_cTransferableVars,
             (List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0);
  EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  return true;
}

Assistant:

bool Serializer::WriteValue(Var rootObject)
        {
            ScriptContext *scriptContext = m_streamWriter.GetScriptContext();
            BEGIN_JS_RUNTIME_CALL(scriptContext)
            {
                Js::SCASerializationEngine::Serialize(rootObject, &m_streamWriter, m_transferableVars, m_cTransferableVars, nullptr /*TBD*/);
            }
            END_JS_RUNTIME_CALL(scriptContext)
                return true;
        }